

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O3

duckdb_logical_type duckdb_list_type_child_type(duckdb_logical_type type)

{
  LogicalType *this;
  LogicalType *other;
  
  if ((type == (duckdb_logical_type)0x0) || (1 < (byte)((char)*type + 0x9bU))) {
    this = (LogicalType *)0x0;
  }
  else {
    this = (LogicalType *)operator_new(0x18);
    other = duckdb::ListType::GetChildType((LogicalType *)type);
    duckdb::LogicalType::LogicalType(this,other);
  }
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_list_type_child_type(duckdb_logical_type type) {
	if (!AssertLogicalTypeId(type, duckdb::LogicalTypeId::LIST) &&
	    !AssertLogicalTypeId(type, duckdb::LogicalTypeId::MAP)) {
		return nullptr;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.id() != duckdb::LogicalTypeId::LIST && logical_type.id() != duckdb::LogicalTypeId::MAP) {
		return nullptr;
	}
	return reinterpret_cast<duckdb_logical_type>(new duckdb::LogicalType(duckdb::ListType::GetChildType(logical_type)));
}